

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O1

void llvm::yaml::MappingTraits<llvm::DWARFYAML::PubEntry>::mapping(IO *IO,PubEntry *Entry)

{
  void *pvVar1;
  EmptyContext local_1b;
  EmptyContext local_1a;
  EmptyContext local_19 [6];
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<llvm::yaml::Hex32,llvm::yaml::EmptyContext>
            (IO,"DieOffset",&Entry->DieOffset,true,local_19);
  pvVar1 = yaml::IO::getContext(IO);
  if (*(char *)((long)pvVar1 + 0x1c) == '\x01') {
    yaml::IO::processKey<llvm::yaml::Hex8,llvm::yaml::EmptyContext>
              (IO,"Descriptor",&Entry->Descriptor,true,&local_1a);
  }
  yaml::IO::processKey<llvm::StringRef,llvm::yaml::EmptyContext>
            (IO,"Name",&Entry->Name,true,&local_1b);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::PubEntry>::mapping(IO &IO,
                                                 DWARFYAML::PubEntry &Entry) {
  IO.mapRequired("DieOffset", Entry.DieOffset);
  if (reinterpret_cast<DWARFYAML::PubSection *>(IO.getContext())->IsGNUStyle)
    IO.mapRequired("Descriptor", Entry.Descriptor);
  IO.mapRequired("Name", Entry.Name);
}